

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplaceRealloc<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,pointer pos,Token *args)

{
  size_type sVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  size_type sVar5;
  size_type capacity;
  iterator pTVar6;
  Token *__result;
  Token *pTVar7;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Token *args_local;
  pointer pos_local;
  SmallVectorBase<slang::parsing::Token> *this_local;
  
  sVar1 = this->len;
  sVar5 = max_size(this);
  if (sVar1 == sVar5) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pTVar6 = begin(this);
  __result = (Token *)slang::detail::allocArray(capacity,0x10);
  pTVar7 = __result + ((long)pos - (long)pTVar6 >> 4);
  uVar2 = args->field_0x2;
  NVar3.raw = (args->numFlags).raw;
  uVar4 = args->rawLen;
  pTVar7->kind = args->kind;
  pTVar7->field_0x2 = uVar2;
  pTVar7->numFlags = (NumericTokenFlags)NVar3.raw;
  pTVar7->rawLen = uVar4;
  pTVar7->info = args->info;
  pTVar6 = end(this);
  if (pos == pTVar6) {
    __first = begin(this);
    pTVar6 = end(this);
    std::uninitialized_move<slang::parsing::Token*,slang::parsing::Token*>(__first,pTVar6,__result);
  }
  else {
    pTVar6 = begin(this);
    std::uninitialized_move<slang::parsing::Token*,slang::parsing::Token*>(pTVar6,pos,__result);
    pTVar6 = end(this);
    std::uninitialized_move<slang::parsing::Token*,slang::parsing::Token*>(pos,pTVar6,pTVar7 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pTVar6);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pTVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}